

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_24fa3d::OSSPlayback::reset(OSSPlayback *this)

{
  FILE *pFVar1;
  ALuint AVar2;
  ALuint AVar3;
  int iVar4;
  ALuint AVar5;
  uint uVar6;
  ALCchar *pAVar7;
  int *piVar8;
  char *pcVar9;
  ALCdevice *pAVar10;
  char *pcVar11;
  int ossFormat;
  ALuint numChannels;
  ALuint ossSpeed;
  audio_buf_info info;
  ALuint numFragmentsLogSize;
  
  ossFormat = 0;
  pAVar10 = (this->super_BackendBase).mDevice;
  switch(pAVar10->FmtType) {
  case DevFmtByte:
    ossFormat = 0x40;
    break;
  case DevFmtUByte:
    ossFormat = 8;
    break;
  case DevFmtUShort:
  case DevFmtInt:
  case DevFmtUInt:
  case DevFmtFloat:
    pAVar10->FmtType = DevFmtShort;
  case DevFmtShort:
    ossFormat = 0x10;
  }
  AVar2 = ALCdevice::channelsFromFmt(pAVar10);
  pAVar10 = (this->super_BackendBase).mDevice;
  ossSpeed = pAVar10->Frequency;
  numChannels = AVar2;
  AVar3 = ALCdevice::bytesFromFmt(pAVar10);
  log2i(((this->super_BackendBase).mDevice)->UpdateSize * AVar3 * AVar2);
  info.fragments = 0;
  info.fragstotal = 0;
  info.fragsize = 0;
  info.bytes = 0;
  ioctl(this->mFd,0xc004500a);
  iVar4 = ioctl(this->mFd,0xc0045005,&ossFormat);
  if (iVar4 < 0) {
    pcVar11 = "ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat)";
  }
  else {
    iVar4 = ioctl(this->mFd,0xc0045006,&numChannels);
    if (iVar4 < 0) {
      pcVar11 = "ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels)";
    }
    else {
      iVar4 = ioctl(this->mFd,0xc0045002,&ossSpeed);
      if (iVar4 < 0) {
        pcVar11 = "ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed)";
      }
      else {
        iVar4 = ioctl(this->mFd,0x8010500c,&info);
        if (-1 < iVar4) {
          AVar5 = ALCdevice::channelsFromFmt((this->super_BackendBase).mDevice);
          pFVar1 = gLogFile;
          if (AVar5 == numChannels) {
            if (ossFormat == 8) {
              pAVar10 = (this->super_BackendBase).mDevice;
              if (pAVar10->FmtType == DevFmtUByte) goto LAB_0015d3aa;
            }
            else if (ossFormat == 0x10) {
              pAVar10 = (this->super_BackendBase).mDevice;
              if (pAVar10->FmtType == DevFmtShort) goto LAB_0015d3aa;
            }
            else if ((ossFormat == 0x40) &&
                    (pAVar10 = (this->super_BackendBase).mDevice, pAVar10->FmtType == DevFmtByte)) {
LAB_0015d3aa:
              pAVar10->Frequency = ossSpeed;
              uVar6 = (uint)info.fragsize / (AVar3 * AVar2);
              pAVar10->UpdateSize = uVar6;
              pAVar10->BufferSize = uVar6 * info.fragments;
              BackendBase::setDefaultChannelOrder(&this->super_BackendBase);
              pAVar10 = (this->super_BackendBase).mDevice;
              AVar2 = pAVar10->UpdateSize;
              AVar3 = ALCdevice::frameSizeFromFmt(pAVar10);
              std::vector<unsigned_char,_al::allocator<unsigned_char,_1UL>_>::resize
                        (&this->mMixData,(ulong)(AVar2 * AVar3));
              return true;
            }
            if ((int)gLogLevel < 1) {
              return false;
            }
            pAVar7 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
            pcVar11 = "[ALSOFT] (EE) Failed to set %s samples, got OSS format %#x\n";
            uVar6 = ossFormat;
          }
          else {
            if ((int)gLogLevel < 1) {
              return false;
            }
            pAVar7 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
            pcVar11 = "[ALSOFT] (EE) Failed to set %s, got %d channels instead\n";
            uVar6 = numChannels;
          }
          fprintf((FILE *)pFVar1,pcVar11,pAVar7,(ulong)uVar6);
          return false;
        }
        pcVar11 = "ioctl(mFd, SNDCTL_DSP_GETOSPACE, &info)";
      }
    }
  }
  pFVar1 = gLogFile;
  if ((int)gLogLevel < 1) {
    return false;
  }
  piVar8 = __errno_location();
  pcVar9 = strerror(*piVar8);
  fprintf((FILE *)pFVar1,"[ALSOFT] (EE) %s failed: %s\n",pcVar11,pcVar9);
  return false;
}

Assistant:

bool OSSPlayback::reset()
{
    int ossFormat{};
    switch(mDevice->FmtType)
    {
        case DevFmtByte:
            ossFormat = AFMT_S8;
            break;
        case DevFmtUByte:
            ossFormat = AFMT_U8;
            break;
        case DevFmtUShort:
        case DevFmtInt:
        case DevFmtUInt:
        case DevFmtFloat:
            mDevice->FmtType = DevFmtShort;
            /* fall-through */
        case DevFmtShort:
            ossFormat = AFMT_S16_NE;
            break;
    }

    ALuint periods{mDevice->BufferSize / mDevice->UpdateSize};
    ALuint numChannels{mDevice->channelsFromFmt()};
    ALuint ossSpeed{mDevice->Frequency};
    ALuint frameSize{numChannels * mDevice->bytesFromFmt()};
    /* According to the OSS spec, 16 bytes (log2(16)) is the minimum. */
    ALuint log2FragmentSize{maxu(log2i(mDevice->UpdateSize*frameSize), 4)};
    ALuint numFragmentsLogSize{(periods << 16) | log2FragmentSize};

    audio_buf_info info{};
    const char *err;
#define CHECKERR(func) if((func) < 0) {                                       \
    err = #func;                                                              \
    goto err;                                                                 \
}
    /* Don't fail if SETFRAGMENT fails. We can handle just about anything
     * that's reported back via GETOSPACE */
    ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize);
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_GETOSPACE, &info));
    if(0)
    {
    err:
        ERR("%s failed: %s\n", err, strerror(errno));
        return false;
    }
#undef CHECKERR

    if(mDevice->channelsFromFmt() != numChannels)
    {
        ERR("Failed to set %s, got %d channels instead\n", DevFmtChannelsString(mDevice->FmtChans),
            numChannels);
        return false;
    }

    if(!((ossFormat == AFMT_S8 && mDevice->FmtType == DevFmtByte) ||
         (ossFormat == AFMT_U8 && mDevice->FmtType == DevFmtUByte) ||
         (ossFormat == AFMT_S16_NE && mDevice->FmtType == DevFmtShort)))
    {
        ERR("Failed to set %s samples, got OSS format %#x\n", DevFmtTypeString(mDevice->FmtType),
            ossFormat);
        return false;
    }

    mDevice->Frequency = ossSpeed;
    mDevice->UpdateSize = static_cast<ALuint>(info.fragsize) / frameSize;
    mDevice->BufferSize = static_cast<ALuint>(info.fragments) * mDevice->UpdateSize;

    setDefaultChannelOrder();

    mMixData.resize(mDevice->UpdateSize * mDevice->frameSizeFromFmt());

    return true;
}